

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::
TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
           *this,TPZCompMesh *cmesh)

{
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    field_0x160 = 0x17edd40;
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix = 0x17ede08;
  *(undefined4 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    field_0x168 = 0;
  (this->
  super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
  field_0x16c = 1;
  TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::
  TPZStructMatrix(&this->
                   super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                  ,&PTR_construction_vtable_104__017eb9f8,cmesh);
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    field_0x160 = 0x17eb980;
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix = 0x17eb7b0;
  *(undefined8 *)
   &(this->
    super_TPZSkylineStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>).
    super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.field_0xa0 = 0x17eb878;
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZCompMesh *cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}